

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkPipelineShaderStageModuleIdentifierCreateInfoEXT *create_info,
          ScratchAllocator *alloc)

{
  uint uVar1;
  void *pvVar2;
  undefined8 uVar3;
  uint8_t *puVar4;
  undefined8 *puVar5;
  void *__dest;
  ptrdiff_t _Num;
  size_t size;
  
  puVar5 = (undefined8 *)ScratchAllocator::allocate_raw(alloc,0x20,0x10);
  if (puVar5 != (undefined8 *)0x0) {
    uVar3 = *(undefined8 *)create_info;
    pvVar2 = create_info->pNext;
    puVar4 = create_info->pIdentifier;
    puVar5[2] = *(undefined8 *)&create_info->identifierSize;
    puVar5[3] = puVar4;
    *puVar5 = uVar3;
    puVar5[1] = pvVar2;
  }
  uVar1 = *(uint *)(puVar5 + 2);
  size = 0x20;
  if (uVar1 < 0x20) {
    size = (size_t)uVar1;
  }
  *(int *)(puVar5 + 2) = (int)size;
  if (uVar1 != 0) {
    pvVar2 = (void *)puVar5[3];
    __dest = ScratchAllocator::allocate_raw(alloc,size,0x10);
    if (__dest != (void *)0x0) {
      memmove(__dest,pvVar2,size);
      goto LAB_001217b3;
    }
  }
  __dest = (void *)0x0;
LAB_001217b3:
  puVar5[3] = __dest;
  return puVar5;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(const VkPipelineShaderStageModuleIdentifierCreateInfoEXT *create_info,
                                             ScratchAllocator &alloc)
{
	auto *identifier = copy(create_info, 1, alloc);
	// Safeguard since we'll be copying these to stack variables later.
	identifier->identifierSize =
			std::min<uint32_t>(identifier->identifierSize, VK_MAX_SHADER_MODULE_IDENTIFIER_SIZE_EXT);
	identifier->pIdentifier = copy(identifier->pIdentifier, identifier->identifierSize, alloc);
	return identifier;
}